

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O0

CURLUcode hostname_check(Curl_URL *u,char *hostname,size_t hlen)

{
  size_t sVar1;
  size_t len;
  size_t hlen_local;
  char *hostname_local;
  Curl_URL *u_local;
  
  if (hlen == 0) {
    u_local._4_4_ = CURLUE_NO_HOST;
  }
  else if (*hostname == '[') {
    u_local._4_4_ = ipv6_parse(u,hostname,hlen);
  }
  else {
    sVar1 = strcspn(hostname," \r\n\t/:#?!@{}[]\\$\'\"^`*<>=;,+&()%");
    if (hlen == sVar1) {
      u_local._4_4_ = CURLUE_OK;
    }
    else {
      u_local._4_4_ = CURLUE_BAD_HOSTNAME;
    }
  }
  return u_local._4_4_;
}

Assistant:

static CURLUcode hostname_check(struct Curl_URL *u, char *hostname,
                                size_t hlen) /* length of hostname */
{
  size_t len;
  DEBUGASSERT(hostname);

  if(!hlen)
    return CURLUE_NO_HOST;
  else if(hostname[0] == '[')
    return ipv6_parse(u, hostname, hlen);
  else {
    /* letters from the second string are not ok */
    len = strcspn(hostname, " \r\n\t/:#?!@{}[]\\$\'\"^`*<>=;,+&()%");
    if(hlen != len)
      /* hostname with bad content */
      return CURLUE_BAD_HOSTNAME;
  }
  return CURLUE_OK;
}